

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcFooting::IfcFooting(IfcFooting *this)

{
  *(undefined ***)&this->field_0x178 = &PTR__Object_00816a50;
  *(undefined8 *)&this->field_0x180 = 0;
  *(char **)&this->field_0x188 = "IfcFooting";
  IfcBuildingElement::IfcBuildingElement
            ((IfcBuildingElement *)this,&PTR_construction_vtable_24__008a9328);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcFooting,_1UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x8a91f8;
  *(undefined8 *)&this->field_0x178 = 0x8a9310;
  *(undefined8 *)&this->field_0x88 = 0x8a9220;
  *(undefined8 *)&this->field_0x98 = 0x8a9248;
  *(undefined8 *)&this->field_0xd0 = 0x8a9270;
  *(undefined8 *)&this->field_0x100 = 0x8a9298;
  *(undefined8 *)&this->field_0x138 = 0x8a92c0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcFooting,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x8a92e8;
  *(undefined1 **)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcFooting,_1UL>).field_0x10 =
       &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcFooting,_1UL>).field_0x20;
  *(undefined8 *)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcFooting,_1UL>).field_0x18 =
       0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcFooting,_1UL>).field_0x20 = 0;
  return;
}

Assistant:

IfcFooting() : Object("IfcFooting") {}